

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O1

Ref __thiscall trun::TestModule::TestCaseFromName(TestModule *this,string *caseName)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __n;
  undefined8 *puVar5;
  Ref RVar6;
  
  puVar5 = (undefined8 *)caseName[0xb]._M_string_length;
  puVar1 = (undefined8 *)caseName[0xb].field_2._M_allocated_capacity;
  __n._M_pi = in_RDX;
  do {
    bVar3 = puVar5 != puVar1;
    if (!bVar3) {
LAB_00162797:
      this->_vptr_TestModule = (_func_int **)0x0;
      *(undefined8 *)&this->state = 0;
LAB_0016279d:
      RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           __n._M_pi;
      RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ref)RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
    }
    this->_vptr_TestModule = (_func_int **)*puVar5;
    lVar2 = puVar5[1];
    *(long *)&this->state = lVar2;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
    __n._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->_vptr_TestModule[9];
    if ((__n._M_pi == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDX->_M_use_count) &&
       ((__n._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
        (iVar4 = bcmp(this->_vptr_TestModule[8],in_RDX->_vptr__Sp_counted_base,(size_t)__n._M_pi),
        __n._M_pi = extraout_RDX, iVar4 == 0)))) {
      if (bVar3) goto LAB_0016279d;
      goto LAB_00162797;
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->state !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->state);
      __n._M_pi = extraout_RDX_00;
    }
    puVar5 = puVar5 + 2;
  } while( true );
}

Assistant:

TestFunc::Ref TestModule::TestCaseFromName(const std::string &caseName) const {
    for (auto func: testFuncs) {
        if (func->CaseName() == caseName) {
            return func;
        }
    }
    return nullptr;
}